

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O1

bool __thiscall
ArmParser::parsePsrTransfer
          (ArmParser *this,Parser *parser,ArmOpcodeVariables *vars,bool shortVersion)

{
  long lVar1;
  byte bVar2;
  long lVar3;
  bool bVar4;
  Token *pTVar5;
  long lVar6;
  uint uVar7;
  bool bVar8;
  ValueType *str;
  
  pTVar5 = Tokenizer::nextToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
  if (pTVar5->type == Identifier) {
    if (*(__index_type *)
         ((long)&(pTVar5->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x04') {
      __assert_fail("std::holds_alternative<Identifier>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x4d,"const Identifier &Token::identifierValue() const");
    }
    str = &pTVar5->value;
    bVar8 = false;
    bVar4 = startsWith((string *)str,"cpsr",0);
    if (!bVar4) {
      bVar4 = startsWith((string *)str,"spsr",0);
      bVar8 = true;
      if (!bVar4) {
        return false;
      }
    }
    (vars->PsrData).spsr = bVar8;
    lVar3 = *(long *)((long)&(pTVar5->value).
                             super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                             .
                             super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                             .
                             super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                             .
                             super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                             .
                             super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                             .
                             super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     + 8);
    if (shortVersion) {
      return lVar3 == 4;
    }
    if (lVar3 == 4) {
      (vars->PsrData).field = 0xf;
      return true;
    }
    if (*(char *)(*(long *)&(str->
                            super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            ).
                            super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            .
                            super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            .
                            super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            .
                            super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            .
                            super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            ._M_u + 4) == '_') {
      bVar4 = startsWith((string *)str,"ctl",5);
      if (bVar4) {
        (vars->PsrData).field = 1;
      }
      else {
        bVar4 = startsWith((string *)str,"flg",5);
        if (!bVar4) {
          (vars->PsrData).field = 0;
          if (*(long *)((long)&(pTVar5->value).
                               super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                               .
                               super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                               .
                               super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                               .
                               super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                               .
                               super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                               .
                               super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       + 8) == 5) {
            return true;
          }
          lVar3 = *(long *)&(str->
                            super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            ).
                            super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            .
                            super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            .
                            super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            .
                            super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            .
                            super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            ._M_u;
          lVar6 = 0;
          do {
            bVar2 = *(byte *)(lVar3 + 5 + lVar6);
            if (bVar2 < 0x73) {
              if (bVar2 == 99) {
                uVar7 = (vars->PsrData).field;
                if ((uVar7 & 1) != 0) {
                  return false;
                }
                uVar7 = uVar7 | 1;
              }
              else {
                if (bVar2 != 0x66) {
                  return false;
                }
                uVar7 = (vars->PsrData).field;
                if ((uVar7 & 8) != 0) {
                  return false;
                }
                uVar7 = uVar7 | 8;
              }
            }
            else if (bVar2 == 0x73) {
              uVar7 = (vars->PsrData).field;
              if ((uVar7 & 4) != 0) {
                return false;
              }
              uVar7 = uVar7 | 4;
            }
            else {
              if (bVar2 != 0x78) {
                return false;
              }
              uVar7 = (vars->PsrData).field;
              if ((uVar7 & 2) != 0) {
                return false;
              }
              uVar7 = uVar7 | 2;
            }
            (vars->PsrData).field = uVar7;
            if (2 < (uint)lVar6) {
              return true;
            }
            lVar1 = lVar6 + 6;
            lVar6 = lVar6 + 1;
          } while (lVar1 != *(long *)((long)&(pTVar5->value).
                                             super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                             .
                                             super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                             .
                                             super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                             .
                                             super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                             .
                                             super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                             .
                                             super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                     + 8));
          return true;
        }
        (vars->PsrData).field = 8;
      }
      return *(long *)((long)&(pTVar5->value).
                              super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      + 8) == 8;
    }
  }
  return false;
}

Assistant:

bool ArmParser::parsePsrTransfer(Parser& parser, ArmOpcodeVariables& vars, bool shortVersion)
{
	const Token& token = parser.nextToken();
	if (token.type != TokenType::Identifier)
		return false;

	const std::string &stringValue = token.identifierValue().string();
	size_t pos = 0;
	if (startsWith(stringValue,"cpsr"))
	{
		vars.PsrData.spsr = false;
		pos = 4;
	} else if (startsWith(stringValue,"spsr"))
	{
		vars.PsrData.spsr = true;
		pos = 4;
	} else {
		return false;
	}

	if (shortVersion)
		return pos == stringValue.size();

	if (pos == stringValue.size())
	{
		vars.PsrData.field = 0xF;
		return true;
	}

	if (stringValue[pos++] != '_')
		return false;

	if (startsWith(stringValue,"ctl",pos))
	{
		vars.PsrData.field = 1;
		return pos+3 == stringValue.size();
	} 
	
	if (startsWith(stringValue,"flg",pos))
	{
		vars.PsrData.field = 8;
		return pos+3 == stringValue.size();
	}
	
	vars.PsrData.field = 0;
	for (int i = 0; i < 4; i++)
	{
		if (pos == stringValue.size())
			break;

		switch(stringValue[pos++])
		{
		case 'f':
			if (vars.PsrData.field & 8)
				return false;	// can only appear once
			vars.PsrData.field |= 8;
			break;
		case 's':
			if (vars.PsrData.field & 4)
				return false;	// can only appear once
			vars.PsrData.field |= 4;
			break;
		case 'x':
			if (vars.PsrData.field & 2)
				return false;	// can only appear once
			vars.PsrData.field |= 2;
			break;
		case 'c':
			if (vars.PsrData.field & 1)
				return false;	// can only appear once
			vars.PsrData.field |= 1;
			break;
		default:
			return false;	// has to be one of those
		}
	}

	return true;
}